

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

exr_result_t unpack_16bit_3chan_planar(exr_decode_pipeline_t *decode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void *__src;
  long in_RDI;
  int y;
  int linc2;
  int linc1;
  int linc0;
  int h;
  int w;
  uint8_t *out2;
  uint8_t *out1;
  uint8_t *out0;
  uint16_t *in2;
  uint16_t *in1;
  uint16_t *in0;
  uint8_t *srcbuffer;
  undefined4 local_58;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_10;
  
  iVar1 = *(int *)(*(long *)(in_RDI + 8) + 0xc);
  iVar2 = *(int *)(in_RDI + 0x2c);
  iVar3 = *(int *)(in_RDI + 100);
  iVar4 = *(int *)(*(long *)(in_RDI + 8) + 0x24);
  iVar5 = *(int *)(*(long *)(in_RDI + 8) + 0x54);
  iVar6 = *(int *)(*(long *)(in_RDI + 8) + 0x84);
  local_30 = *(void **)(*(long *)(in_RDI + 8) + 0x28);
  local_38 = *(void **)(*(long *)(in_RDI + 8) + 0x58);
  local_40 = *(void **)(*(long *)(in_RDI + 8) + 0x88);
  local_10 = (void *)(*(long *)(in_RDI + 0x88) + (long)(*(int *)(in_RDI + 0x60) * iVar1 * 6));
  for (local_58 = *(int *)(in_RDI + 0x60); local_58 < iVar2 - iVar3; local_58 = local_58 + 1) {
    __src = (void *)((long)local_10 + (long)iVar1 * 2);
    memcpy(local_30,local_10,(long)iVar1 << 1);
    memcpy(local_38,__src,(long)iVar1 << 1);
    memcpy(local_40,(void *)((long)__src + (long)iVar1 * 2),(long)iVar1 << 1);
    local_30 = (void *)((long)local_30 + (long)iVar4);
    local_38 = (void *)((long)local_38 + (long)iVar5);
    local_40 = (void *)((long)local_40 + (long)iVar6);
    local_10 = (void *)((long)local_10 + (long)(iVar1 * 6));
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_3chan_planar (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t *       out0, *out1, *out2;
    int             w, h;
    int             linc0, linc1, linc2;

    w     = decode->channels[0].width;
    h     = decode->chunk.height - decode->user_line_end_ignore;
    linc0 = decode->channels[0].user_line_stride;
    linc1 = decode->channels[1].user_line_stride;
    linc2 = decode->channels[2].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;
    out1 = decode->channels[1].decode_to_ptr;
    out2 = decode->channels[2].decode_to_ptr;

    /*
     * not actually using y in the loop, so just pre-increment
     * the srcbuffer for any skip
     */
    srcbuffer += decode->user_line_begin_skip * w * 6;

    // planar output
    for (int y = decode->user_line_begin_skip; y < h; ++y)
    {
        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;
        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
                            /* specialise to memcpy if we can */
#if EXR_HOST_IS_NOT_LITTLE_ENDIAN
        for (int x = 0; x < w; ++x)
            *(((uint16_t*) out0) + x) = one_to_native16 (in0[x]);
        for (int x = 0; x < w; ++x)
            *(((uint16_t*) out1) + x) = one_to_native16 (in1[x]);
        for (int x = 0; x < w; ++x)
            *(((uint16_t*) out2) + x) = one_to_native16 (in2[x]);
#else
        memcpy (out0, in0, (size_t) (w) * sizeof (uint16_t));
        memcpy (out1, in1, (size_t) (w) * sizeof (uint16_t));
        memcpy (out2, in2, (size_t) (w) * sizeof (uint16_t));
#endif
        out0 += linc0;
        out1 += linc1;
        out2 += linc2;
    }

    return EXR_ERR_SUCCESS;
}